

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShow.c
# Opt level: O3

int Gia_ShowCollectObjs_rec
              (Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vAdds,Vec_Int_t *vXors,Vec_Int_t *vMapAdds,
              Vec_Int_t *vMapXors,Vec_Int_t *vOrder)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  int Fill;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  
  pGVar2 = p->pObjs;
  if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
LAB_007bcfec:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar12 = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= (int)uVar12) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  piVar9 = p->pTravIds;
  if (piVar9[(int)uVar12] == p->nTravIds) {
    pVVar3 = p->vLevels;
    Vec_IntFillExtra(pVVar3,uVar12 + 1,uVar12);
    if (((int)uVar12 < 0) || (pVVar3->nSize <= (int)uVar12)) goto LAB_007bcfcd;
    iVar6 = pVVar3->pArray[uVar12 & 0x7fffffff];
  }
  else {
    piVar9[(int)uVar12] = p->nTravIds;
    iVar6 = 0;
    if ((~*(uint *)pObj & 0x9fffffff) != 0) {
      if (pGVar2 + p->nObjs <= pObj) goto LAB_007bcfec;
      if (((int)uVar12 < 0) || (vMapAdds->nSize <= (int)uVar12)) goto LAB_007bcfcd;
      uVar11 = (ulong)(uint)vMapAdds->pArray[uVar12 & 0x7fffffff];
      if (vMapAdds->pArray[uVar12 & 0x7fffffff] < 0) {
        if (vMapXors->nSize <= (int)uVar12) goto LAB_007bcfcd;
        iVar5 = vMapXors->pArray[uVar12 & 0x7fffffff];
        if (iVar5 < 0) {
          iVar6 = Gia_ObjIsMux(p,pObj);
          if (iVar6 != 0) {
            __assert_fail("!Gia_ObjIsMux(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaShow.c"
                          ,0x438,
                          "int Gia_ShowCollectObjs_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          iVar5 = Gia_ShowCollectObjs_rec
                            (p,pObj + -(*(ulong *)pObj & 0x1fffffff),vAdds,vXors,vMapAdds,vMapXors,
                             vOrder);
          iVar6 = Gia_ShowCollectObjs_rec
                            (p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),vAdds,vXors,
                             vMapAdds,vMapXors,vOrder);
          if (iVar6 < iVar5) {
            iVar6 = iVar5;
          }
          iVar6 = iVar6 + 1;
          Gia_ObjSetLevel(p,pObj,iVar6);
        }
        else {
          uVar12 = iVar5 * 4 + 1;
          if (vXors->nSize <= (int)uVar12) goto LAB_007bcfcd;
          iVar6 = vXors->pArray[uVar12];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
LAB_007bd00b:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          iVar8 = Gia_ShowCollectObjs_rec(p,pGVar2 + iVar6,vAdds,vXors,vMapAdds,vMapXors,vOrder);
          uVar12 = iVar5 << 2 | 2;
          if (vXors->nSize <= (int)uVar12) goto LAB_007bcfcd;
          iVar6 = vXors->pArray[uVar12];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_007bd00b;
          iVar6 = Gia_ShowCollectObjs_rec(p,p->pObjs + iVar6,vAdds,vXors,vMapAdds,vMapXors,vOrder);
          uVar12 = iVar5 << 2 | 3;
          if (vXors->nSize <= (int)uVar12) goto LAB_007bcfcd;
          uVar12 = vXors->pArray[uVar12];
          if ((ulong)uVar12 == 0) {
            iVar5 = 0;
          }
          else {
            if (((int)uVar12 < 0) || (p->nObjs <= (int)uVar12)) goto LAB_007bd00b;
            iVar5 = Gia_ShowCollectObjs_rec
                              (p,p->pObjs + uVar12,vAdds,vXors,vMapAdds,vMapXors,vOrder);
          }
          if (iVar6 < iVar8) {
            iVar6 = iVar8;
          }
          if (iVar6 <= iVar5) {
            iVar6 = iVar5;
          }
          pGVar2 = p->pObjs;
          if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) goto LAB_007bcfec;
          uVar12 = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
          pVVar3 = p->vLevels;
          Vec_IntFillExtra(pVVar3,uVar12 + 1,-0x55555555);
          if (((int)uVar12 < 0) || (pVVar3->nSize <= (int)uVar12)) goto LAB_007bd049;
          iVar6 = iVar6 + 1;
          pVVar3->pArray[uVar12 & 0x7fffffff] = iVar6;
        }
      }
      else {
        uVar12 = (uint)(uVar11 * 6);
        if (vAdds->nSize <= (int)(uVar12 + 3)) goto LAB_007bcfcd;
        piVar4 = vAdds->pArray;
        if (p->nTravIdsAlloc <= piVar4[uVar11 * 6 + 3]) {
LAB_007bd068:
          __assert_fail("Id < p->nTravIdsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x265,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
        }
        iVar6 = p->nTravIds;
        piVar9[piVar4[uVar11 * 6 + 3]] = iVar6;
        uVar10 = uVar12 + 4;
        if (vAdds->nSize <= (int)uVar10) goto LAB_007bcfcd;
        if (p->nTravIdsAlloc <= piVar4[uVar10]) goto LAB_007bd068;
        piVar9[piVar4[uVar10]] = iVar6;
        if (vAdds->nSize <= (int)uVar12) goto LAB_007bcfcd;
        iVar6 = piVar4[uVar11 * 6 & 0xffffffff];
        if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_007bd00b;
        iVar5 = Gia_ShowCollectObjs_rec(p,pGVar2 + iVar6,vAdds,vXors,vMapAdds,vMapXors,vOrder);
        if (vAdds->nSize <= (int)(uVar12 | 1)) goto LAB_007bcfcd;
        iVar6 = vAdds->pArray[uVar12 | 1];
        if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_007bd00b;
        iVar6 = Gia_ShowCollectObjs_rec(p,p->pObjs + iVar6,vAdds,vXors,vMapAdds,vMapXors,vOrder);
        iVar8 = vAdds->nSize;
        if (iVar8 <= (int)(uVar12 + 2)) {
LAB_007bcfcd:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar1 = vAdds->pArray[uVar12 + 2];
        if ((ulong)uVar1 == 0) {
          iVar7 = 0;
        }
        else {
          if (((int)uVar1 < 0) || (p->nObjs <= (int)uVar1)) goto LAB_007bd00b;
          iVar7 = Gia_ShowCollectObjs_rec(p,p->pObjs + uVar1,vAdds,vXors,vMapAdds,vMapXors,vOrder);
          iVar8 = vAdds->nSize;
        }
        if (iVar6 < iVar5) {
          iVar6 = iVar5;
        }
        if (iVar6 <= iVar7) {
          iVar6 = iVar7;
        }
        if (iVar8 <= (int)(uVar12 + 3)) goto LAB_007bcfcd;
        iVar8 = vAdds->pArray[uVar11 * 6 + 3];
        pVVar3 = p->vLevels;
        Vec_IntFillExtra(pVVar3,iVar8 + 1,iVar5);
        if (((long)iVar8 < 0) || (pVVar3->nSize <= iVar8)) {
LAB_007bd049:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        iVar6 = iVar6 + 1;
        pVVar3->pArray[iVar8] = iVar6;
        if (vAdds->nSize <= (int)uVar10) goto LAB_007bcfcd;
        iVar5 = vAdds->pArray[uVar10];
        pVVar3 = p->vLevels;
        Vec_IntFillExtra(pVVar3,iVar5 + 1,Fill);
        if (((long)iVar5 < 0) || (pVVar3->nSize <= iVar5)) goto LAB_007bd049;
        pVVar3->pArray[iVar5] = iVar6;
        if (vAdds->nSize <= (int)uVar10) goto LAB_007bcfcd;
        iVar5 = vAdds->pArray[uVar10];
        if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_007bd00b;
        pObj = p->pObjs + iVar5;
      }
      pGVar2 = p->pObjs;
      if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) goto LAB_007bcfec;
      uVar12 = vOrder->nSize;
      if (uVar12 == vOrder->nCap) {
        if ((int)uVar12 < 0x10) {
          if (vOrder->pArray == (int *)0x0) {
            piVar9 = (int *)malloc(0x40);
          }
          else {
            piVar9 = (int *)realloc(vOrder->pArray,0x40);
          }
          vOrder->pArray = piVar9;
          if (piVar9 == (int *)0x0) {
LAB_007bd087:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          vOrder->nCap = 0x10;
        }
        else {
          if (vOrder->pArray == (int *)0x0) {
            piVar9 = (int *)malloc((ulong)uVar12 * 8);
          }
          else {
            piVar9 = (int *)realloc(vOrder->pArray,(ulong)uVar12 * 8);
          }
          vOrder->pArray = piVar9;
          if (piVar9 == (int *)0x0) goto LAB_007bd087;
          vOrder->nCap = uVar12 * 2;
        }
      }
      else {
        piVar9 = vOrder->pArray;
      }
      iVar5 = vOrder->nSize;
      vOrder->nSize = iVar5 + 1;
      piVar9[iVar5] = (int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555;
      iVar5 = p->nLevels;
      if (p->nLevels <= iVar6) {
        iVar5 = iVar6;
      }
      p->nLevels = iVar5;
    }
  }
  return iVar6;
}

Assistant:

int Gia_ShowCollectObjs_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vAdds, Vec_Int_t * vXors, Vec_Int_t * vMapAdds, Vec_Int_t * vMapXors, Vec_Int_t * vOrder )
{
    int Level0, Level1, Level2 = 0, Level = 0;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return Gia_ObjLevel(p, pObj);
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
        return 0;
    if ( Vec_IntEntry(vMapAdds, Gia_ObjId(p, pObj)) >= 0 )
    {
        int iBox = Vec_IntEntry(vMapAdds, Gia_ObjId(p, pObj));
        Gia_ObjSetTravIdCurrentId(p, Vec_IntEntry(vAdds, 6*iBox+3) );
        Gia_ObjSetTravIdCurrentId(p, Vec_IntEntry(vAdds, 6*iBox+4) );
        Level0 = Gia_ShowCollectObjs_rec( p, Gia_ManObj( p, Vec_IntEntry(vAdds, 6*iBox+0) ), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        Level1 = Gia_ShowCollectObjs_rec( p, Gia_ManObj( p, Vec_IntEntry(vAdds, 6*iBox+1) ), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        if ( Vec_IntEntry(vAdds, 6*iBox+2) )
        Level2 = Gia_ShowCollectObjs_rec( p, Gia_ManObj( p, Vec_IntEntry(vAdds, 6*iBox+2) ), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        Level = 1 + Abc_MaxInt( Abc_MaxInt(Level0, Level1), Level2 );
        Gia_ObjSetLevelId( p, Vec_IntEntry(vAdds, 6*iBox+3), Level );
        Gia_ObjSetLevelId( p, Vec_IntEntry(vAdds, 6*iBox+4), Level );
        pObj = Gia_ManObj( p, Vec_IntEntry(vAdds, 6*iBox+4) );
    }
    else if ( Vec_IntEntry(vMapXors, Gia_ObjId(p, pObj)) >= 0 )
    {
        int iXor = Vec_IntEntry(vMapXors, Gia_ObjId(p, pObj));
        Level0 = Gia_ShowCollectObjs_rec( p, Gia_ManObj( p, Vec_IntEntry(vXors, 4*iXor+1) ), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        Level1 = Gia_ShowCollectObjs_rec( p, Gia_ManObj( p, Vec_IntEntry(vXors, 4*iXor+2) ), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        if ( Vec_IntEntry(vXors, 4*iXor+3) )
        Level2 = Gia_ShowCollectObjs_rec( p, Gia_ManObj( p, Vec_IntEntry(vXors, 4*iXor+3) ), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        Level = 1 + Abc_MaxInt( Abc_MaxInt(Level0, Level1), Level2 );
        Gia_ObjSetLevel( p, pObj, Level );
    }
    else
    {
        assert( !Gia_ObjIsMux(p, pObj) );
        Level0 = Gia_ShowCollectObjs_rec( p, Gia_ObjFanin0(pObj), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        Level1 = Gia_ShowCollectObjs_rec( p, Gia_ObjFanin1(pObj), vAdds, vXors, vMapAdds, vMapXors, vOrder );
        Level = 1 + Abc_MaxInt(Level0, Level1);
        Gia_ObjSetLevel( p, pObj, Level );
    }
    Vec_IntPush( vOrder, Gia_ObjId(p, pObj) );
    p->nLevels = Abc_MaxInt( p->nLevels, Level );
    return Level;
}